

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O2

size_t absl::lts_20240722::cord_internal::GetMorePreciseMemoryUsage(Nonnull<const_CordRep_*> rep)

{
  size_t sVar1;
  bool bVar2;
  CordRepCrc *pCVar3;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2> raw_usage;
  
  raw_usage.total = 0;
  raw_usage.counted._M_h._M_buckets = &raw_usage.counted._M_h._M_single_bucket;
  raw_usage.counted._M_h._M_bucket_count = 1;
  raw_usage.counted._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  raw_usage.counted._M_h._M_element_count = 0;
  raw_usage.counted._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  raw_usage.counted._M_h._M_rehash_policy._M_next_resize = 0;
  raw_usage.counted._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (rep->tag == '\x02') {
    anon_unknown_0::RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2>::Add
              (&raw_usage,0x20,
               (CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2>)rep);
    pCVar3 = CordRep::crc(rep);
    if (pCVar3->child == (CordRep *)0x0) goto LAB_00119008;
    pCVar3 = CordRep::crc(rep);
    rep = pCVar3->child;
  }
  bVar2 = IsDataEdge(rep);
  if (bVar2) {
    anon_unknown_0::
    AnalyzeDataEdge<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2>
              ((CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2>)rep,
               &raw_usage);
  }
  else {
    if (rep->tag != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord_analysis.cc"
                    ,0xae,
                    "size_t absl::cord_internal::(anonymous namespace)::GetEstimatedUsage(absl::Nonnull<const CordRep *>) [mode = absl::cord_internal::(anonymous namespace)::Mode::kTotalMorePrecise]"
                   );
    }
    anon_unknown_0::AnalyzeBtree<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2>
              ((CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)2>)rep,
               &raw_usage);
  }
LAB_00119008:
  sVar1 = raw_usage.total;
  std::
  _Hashtable<const_absl::lts_20240722::cord_internal::CordRep_*,_const_absl::lts_20240722::cord_internal::CordRep_*,_std::allocator<const_absl::lts_20240722::cord_internal::CordRep_*>,_std::__detail::_Identity,_std::equal_to<const_absl::lts_20240722::cord_internal::CordRep_*>,_std::hash<const_absl::lts_20240722::cord_internal::CordRep_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&raw_usage.counted._M_h);
  return sVar1;
}

Assistant:

size_t GetMorePreciseMemoryUsage(absl::Nonnull<const CordRep*> rep) {
  return GetEstimatedUsage<Mode::kTotalMorePrecise>(rep);
}